

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,str_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  byte bVar5;
  ulong uVar6;
  size_t __n;
  size_t size;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  buffer<char> *c;
  ulong uVar10;
  char __tmp;
  size_t __len;
  size_t __n_00;
  
  uVar6 = (ulong)(uint)specs->width;
  uVar9 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n_00 = uVar6 - uVar9;
  if (uVar6 < uVar9 || __n_00 == 0) {
    uVar9 = uVar9 + lVar3;
    if ((ulong)puVar2[3] < uVar9) {
      (**(code **)*puVar2)(puVar2,uVar9);
    }
    puVar2[2] = uVar9;
    __n = f->size_;
    if (__n != 0) {
      pvVar8 = (void *)(lVar3 + puVar2[1]);
LAB_0011f5e6:
      memmove(pvVar8,f->s,__n);
      return;
    }
  }
  else {
    uVar10 = lVar3 + uVar6;
    if ((ulong)puVar2[3] < uVar10) {
      (**(code **)*puVar2)(puVar2,uVar10);
    }
    puVar2[2] = uVar10;
    pvVar7 = (void *)(lVar3 + puVar2[1]);
    bVar1 = (specs->fill).data_[0];
    bVar5 = specs->field_0x9 & 0xf;
    if (bVar5 == 3) {
      uVar10 = __n_00 >> 1;
      pvVar8 = pvVar7;
      if (1 < __n_00) {
        pvVar8 = (void *)((long)pvVar7 + uVar10);
        memset(pvVar7,(uint)bVar1,uVar10);
      }
      sVar4 = f->size_;
      if (sVar4 != 0) {
        memmove(pvVar8,f->s,sVar4);
      }
      if (uVar6 != uVar9) {
        __n_00 = __n_00 - uVar10;
        pvVar7 = (void *)((long)pvVar8 + sVar4);
LAB_0011f67d:
        memset(pvVar7,(uint)bVar1,__n_00);
        return;
      }
    }
    else if (bVar5 == 2) {
      pvVar8 = pvVar7;
      if (uVar6 != uVar9) {
        pvVar8 = (void *)((long)pvVar7 + __n_00);
        memset(pvVar7,(uint)bVar1,__n_00);
      }
      __n = f->size_;
      if (__n != 0) goto LAB_0011f5e6;
    }
    else {
      sVar4 = f->size_;
      if (sVar4 != 0) {
        memmove(pvVar7,f->s,sVar4);
      }
      if (uVar6 != uVar9) {
        pvVar7 = (void *)((long)pvVar7 + sVar4);
        goto LAB_0011f67d;
      }
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }